

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseDecl(Parser *this,char *filename)

{
  FieldDef *pFVar1;
  Definition *pDVar2;
  iterator iVar3;
  StructDef *suffix;
  bool bVar4;
  unsigned_short uVar5;
  voffset_t vVar6;
  uint uVar7;
  ulong uVar8;
  string *psVar9;
  Value *pVVar10;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *struct_def_00;
  size_type_conflict sVar11;
  reference ppFVar12;
  FieldDef **ppFVar13;
  reference ppFVar14;
  char *pcVar15;
  Type *this_00;
  pointer in_RDX;
  int t;
  byte local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [8];
  string qualified_name;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  CheckedError local_277;
  byte local_275;
  unsigned_short local_274;
  allocator<char> local_271;
  undefined1 local_270 [3];
  bool done;
  voffset_t id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  string *id_str;
  FieldDef *field;
  iterator iStack_238;
  voffset_t i;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_230;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1b0;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1a8;
  iterator it;
  size_t num_id_fields;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  string local_188 [39];
  byte local_161;
  size_t local_160;
  size_t align;
  string local_150;
  Value *local_130;
  Value *force_align;
  string local_120;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  byte local_b1;
  StructDef *local_b0;
  StructDef *struct_def;
  string local_a0 [8];
  string name;
  allocator<char> local_71;
  string local_70 [55];
  byte local_39;
  undefined1 local_38 [7];
  bool fixed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  char *filename_local;
  Parser *this_local;
  CheckedError *ce;
  
  dc.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(filename + 0x48));
  local_39 = IsIdent((Parser *)filename,"struct");
  if (((bool)local_39) || (bVar4 = IsIdent((Parser *)filename,"table"), bVar4)) {
    name.field_2._M_local_buf[0xf] = '\0';
    Next(this);
    bVar4 = CheckedError::Check((CheckedError *)this);
    if (bVar4) {
      name.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar4) {
      std::__cxx11::string::string(local_a0,(string *)(filename + 0x28));
      struct_def._7_1_ = 0;
      t = (int)filename;
      Expect(this,t);
      bVar4 = CheckedError::Check((CheckedError *)this);
      if (bVar4) {
        struct_def._7_1_ = 1;
      }
      if ((struct_def._7_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (!bVar4) {
        local_b1 = 0;
        StartStruct(this,(string *)filename,(StructDef **)local_a0);
        bVar4 = CheckedError::Check((CheckedError *)this);
        if (bVar4) {
          local_b1 = 1;
        }
        if ((local_b1 & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (!bVar4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&(local_b0->super_Definition).doc_comment,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_38);
          local_b0->fixed = (bool)(local_39 & 1);
          if ((dc.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
             (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,
                       (char *)dc.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f9);
            FilePath(&local_d8,(string *)(filename + 0x620),&local_f8,(bool)(filename[0x4e4] & 1));
            psVar9 = GetPooledString((Parser *)filename,&local_d8);
            (local_b0->super_Definition).declaration_file = psVar9;
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::allocator<char>::~allocator(&local_f9);
          }
          local_fa = 0;
          ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
          bVar4 = CheckedError::Check((CheckedError *)this);
          if (bVar4) {
            local_fa = 1;
          }
          if ((local_fa & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (!bVar4) {
            pDVar2 = &local_b0->super_Definition;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"original_order",
                       (allocator<char> *)((long)&force_align + 7));
            pVVar10 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar2->attributes,&local_120);
            local_459 = 0;
            if (pVVar10 == (Value *)0x0) {
              local_459 = local_39 ^ 0xff;
            }
            local_b0->sortbysize = (bool)(local_459 & 1);
            std::__cxx11::string::~string((string *)&local_120);
            std::allocator<char>::~allocator((allocator<char> *)((long)&force_align + 7));
            force_align._6_1_ = 0;
            Expect(this,t);
            bVar4 = CheckedError::Check((CheckedError *)this);
            if (bVar4) {
              force_align._6_1_ = 1;
            }
            if ((force_align._6_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!bVar4) {
LAB_001251e8:
              if (*(int *)(filename + 0x1c) != 0x7d) goto code_r0x001251f9;
              if ((local_39 & 1) != 0) {
                pDVar2 = &local_b0->super_Definition;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_150,"force_align",(allocator<char> *)((long)&align + 7))
                ;
                pVVar10 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar2->attributes,&local_150);
                std::__cxx11::string::~string((string *)&local_150);
                std::allocator<char>::~allocator((allocator<char> *)((long)&align + 7));
                local_130 = pVVar10;
                if (pVVar10 != (Value *)0x0) {
                  local_161 = 0;
                  ParseAlignAttribute(this,(string *)filename,(size_t)&pVVar10->constant,
                                      (size_t *)local_b0->minalign);
                  bVar4 = CheckedError::Check((CheckedError *)this);
                  if (bVar4) {
                    local_161 = 1;
                  }
                  if ((local_161 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar4) goto LAB_00126393;
                  local_b0->minalign = local_160;
                }
                if (local_b0->bytesize == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_188,"size 0 structs not allowed",
                             (allocator<char> *)((long)&fields + 7));
                  Error(this,(string *)filename);
                  std::__cxx11::string::~string(local_188);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&fields + 7));
                  goto LAB_00126393;
                }
              }
              StructDef::PadLastField(local_b0,local_b0->minalign);
              struct_def_00 = &(local_b0->fields).vec;
              if (((local_39 & 1) != 0) ||
                 (sVar11 = std::
                           vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           ::size(struct_def_00), sVar11 == 0)) goto LAB_00125d61;
              it._M_current = (FieldDef **)0x0;
              local_1a8._M_current =
                   (FieldDef **)
                   std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                   begin(struct_def_00);
              while( true ) {
                local_1b0._M_current =
                     (FieldDef **)
                     std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ::end(struct_def_00);
                bVar4 = __gnu_cxx::operator!=(&local_1a8,&local_1b0);
                iVar3 = it;
                if (!bVar4) break;
                ppFVar12 = __gnu_cxx::
                           __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                           ::operator*(&local_1a8);
                pFVar1 = *ppFVar12;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d0,"id",&local_1d1);
                pVVar10 = SymbolTable<flatbuffers::Value>::Lookup
                                    (&(pFVar1->super_Definition).attributes,&local_1d0);
                std::__cxx11::string::~string((string *)&local_1d0);
                std::allocator<char>::~allocator(&local_1d1);
                if (pVVar10 != (Value *)0x0) {
                  it._M_current = it._M_current + 1;
                }
                __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator++(&local_1a8);
              }
              if ((it._M_current == (FieldDef **)0x0) && ((filename[0x67c] & 1U) == 0)) {
LAB_00125d61:
                suffix = local_b0;
                qualified_name.field_2._M_local_buf[0xf] = '\0';
                pcVar15 = UnionTypeFieldSuffix();
                CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                 *)filename,(StructDef *)struct_def_00,(char *)suffix,
                           (BaseType)pcVar15);
                bVar4 = CheckedError::Check((CheckedError *)this);
                if (bVar4) {
                  qualified_name.field_2._M_local_buf[0xf] = '\x01';
                }
                if ((qualified_name.field_2._M_local_buf[0xf] & 1U) == 0) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (!bVar4) {
                  qualified_name.field_2._M_local_buf[0xe] = '\0';
                  CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                   *)filename,(StructDef *)struct_def_00,(char *)local_b0,0x1b727b);
                  bVar4 = CheckedError::Check((CheckedError *)this);
                  if (bVar4) {
                    qualified_name.field_2._M_local_buf[0xe] = '\x01';
                  }
                  if ((qualified_name.field_2._M_local_buf[0xe] & 1U) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (!bVar4) {
                    qualified_name.field_2._M_local_buf[0xd] = '\0';
                    CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                     *)filename,(StructDef *)struct_def_00,(char *)local_b0,0x1b7280
                              );
                    bVar4 = CheckedError::Check((CheckedError *)this);
                    if (bVar4) {
                      qualified_name.field_2._M_local_buf[0xd] = '\x01';
                    }
                    if ((qualified_name.field_2._M_local_buf[0xd] & 1U) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (!bVar4) {
                      qualified_name.field_2._M_local_buf[0xc] = '\0';
                      CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                       *)filename,(StructDef *)struct_def_00,(char *)local_b0,
                                 0x1b9799);
                      bVar4 = CheckedError::Check((CheckedError *)this);
                      if (bVar4) {
                        qualified_name.field_2._M_local_buf[0xc] = '\x01';
                      }
                      if ((qualified_name.field_2._M_local_buf[0xc] & 1U) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (!bVar4) {
                        qualified_name.field_2._M_local_buf[0xb] = '\0';
                        CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                         *)filename,(StructDef *)struct_def_00,(char *)local_b0,
                                   0x1b7288);
                        bVar4 = CheckedError::Check((CheckedError *)this);
                        if (bVar4) {
                          qualified_name.field_2._M_local_buf[0xb] = '\x01';
                        }
                        if ((qualified_name.field_2._M_local_buf[0xb] & 1U) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (!bVar4) {
                          qualified_name.field_2._M_local_buf[10] = '\0';
                          CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                           *)filename,(StructDef *)struct_def_00,(char *)local_b0,
                                     0x1b7295);
                          bVar4 = CheckedError::Check((CheckedError *)this);
                          if (bVar4) {
                            qualified_name.field_2._M_local_buf[10] = '\x01';
                          }
                          if ((qualified_name.field_2._M_local_buf[10] & 1U) == 0) {
                            CheckedError::~CheckedError((CheckedError *)this);
                          }
                          if (!bVar4) {
                            qualified_name.field_2._M_local_buf[9] = '\0';
                            Expect(this,t);
                            bVar4 = CheckedError::Check((CheckedError *)this);
                            if (bVar4) {
                              qualified_name.field_2._M_local_buf[9] = '\x01';
                            }
                            if ((qualified_name.field_2._M_local_buf[9] & 1U) == 0) {
                              CheckedError::~CheckedError((CheckedError *)this);
                            }
                            if (!bVar4) {
                              Namespace::GetFullyQualifiedName
                                        ((string *)local_3c0,*(Namespace **)(filename + 0x198),
                                         (string *)local_b0,1000);
                              this_00 = (Type *)operator_new(0x20);
                              Type::Type(this_00,BASE_TYPE_STRUCT,local_b0,(EnumDef *)0x0,0);
                              bVar4 = SymbolTable<flatbuffers::Type>::Add
                                                ((SymbolTable<flatbuffers::Type> *)(filename + 0x60)
                                                 ,(string *)local_3c0,this_00);
                              if (bVar4) {
                                std::operator+(&local_3e0,"datatype already exists: ",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_3c0);
                                Error(this,(string *)filename);
                                std::__cxx11::string::~string((string *)&local_3e0);
                              }
                              else {
                                anon_unknown_0::NoError();
                              }
                              std::__cxx11::string::~string((string *)local_3c0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00126393;
              }
              ppFVar13 = (FieldDef **)
                         std::
                         vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                         size(struct_def_00);
              if (iVar3._M_current == ppFVar13) {
                local_230._M_current =
                     (FieldDef **)
                     std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ::begin(struct_def_00);
                iStack_238 = std::
                             vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                             ::end(struct_def_00);
                std::
                sort<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,bool(*)(flatbuffers::FieldDef_const*,flatbuffers::FieldDef_const*)>
                          (local_230,
                           (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            )iStack_238._M_current,anon_unknown_0::compareFieldDefs);
                sVar11 = std::
                         vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                         size(struct_def_00);
                uVar5 = std::numeric_limits<unsigned_short>::max();
                if (uVar5 < sVar11) {
                  __assert_fail("fields.size() <= flatbuffers::numeric_limits<voffset_t>::max()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                                ,0xaf8,"CheckedError flatbuffers::Parser::ParseDecl(const char *)");
                }
                field._6_2_ = 0;
                while( true ) {
                  uVar7 = (uint)field._6_2_;
                  sVar11 = std::
                           vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           ::size(struct_def_00);
                  if (((uint)sVar11 & 0xffff) <= uVar7) goto LAB_00125d61;
                  ppFVar14 = std::
                             vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                             ::operator[](struct_def_00,(ulong)field._6_2_);
                  id_str = (string *)*ppFVar14;
                  pDVar2 = &((value_type)id_str)->super_Definition;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_270,"id",&local_271);
                  pVVar10 = SymbolTable<flatbuffers::Value>::Lookup
                                      (&pDVar2->attributes,(string *)local_270);
                  std::__cxx11::string::~string((string *)local_270);
                  std::allocator<char>::~allocator(&local_271);
                  local_274 = 0;
                  local_250 = &pVVar10->constant;
                  pcVar15 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_short>
                            ((anon_unknown_0 *)&local_277,pcVar15,(Parser *)filename,&local_274);
                  bVar4 = CheckedError::Check(&local_277);
                  CheckedError::~CheckedError(&local_277);
                  local_275 = (bVar4 ^ 0xffU) & 1;
                  if (local_275 == 0) break;
                  if (field._6_2_ != local_274) {
                    NumToString<unsigned_short>(&local_398,field._6_2_);
                    std::operator+(&local_378,"field id\'s must be consecutive from 0, id ",
                                   &local_398);
                    std::operator+(&local_358,&local_378," missing or set twice, field: ");
                    std::operator+(&local_338,&local_358,id_str);
                    std::operator+(&local_318,&local_338,", id: ");
                    std::operator+(&local_2f8,&local_318,local_250);
                    Error(this,(string *)filename);
                    std::__cxx11::string::~string((string *)&local_2f8);
                    std::__cxx11::string::~string((string *)&local_318);
                    std::__cxx11::string::~string((string *)&local_338);
                    std::__cxx11::string::~string((string *)&local_358);
                    std::__cxx11::string::~string((string *)&local_378);
                    std::__cxx11::string::~string((string *)&local_398);
                    goto LAB_00126393;
                  }
                  vVar6 = FieldIndexToOffset(field._6_2_);
                  *(voffset_t *)&id_str[8]._M_string_length = vVar6;
                  field._6_2_ = field._6_2_ + 1;
                }
                std::operator+(&local_2d8,"field id\'s must be non-negative number, field: ",id_str)
                ;
                std::operator+(&local_2b8,&local_2d8,", id: ");
                std::operator+(&local_298,&local_2b8,local_250);
                Error(this,(string *)filename);
                std::__cxx11::string::~string((string *)&local_298);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_2d8);
              }
              else if ((filename[0x67c] & 1U) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (local_220,"either all fields or no fields must have an \'id\' attribute",
                           &local_221);
                Error(this,(string *)filename);
                std::__cxx11::string::~string(local_220);
                std::allocator<char>::~allocator(&local_221);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (local_1f8,
                           "all fields must have an \'id\' attribute when --require-explicit-ids is used"
                           ,&local_1f9);
                Error(this,(string *)filename);
                std::__cxx11::string::~string(local_1f8);
                std::allocator<char>::~allocator(&local_1f9);
              }
            }
          }
        }
      }
LAB_00126393:
      std::__cxx11::string::~string(local_a0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"declaration expected",&local_71);
    Error(this,(string *)filename);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return SUB82(this,0);
code_r0x001251f9:
  force_align._5_1_ = 0;
  ParseField(this,(StructDef *)filename);
  bVar4 = CheckedError::Check((CheckedError *)this);
  if (bVar4) {
    force_align._5_1_ = 1;
  }
  if ((force_align._5_1_ & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (bVar4) goto LAB_00126393;
  goto LAB_001251e8;
}

Assistant:

CheckedError Parser::ParseDecl(const char *filename) {
  std::vector<std::string> dc = doc_comment_;
  bool fixed = IsIdent("struct");
  if (!fixed && !IsIdent("table")) return Error("declaration expected");
  NEXT();
  std::string name = attribute_;
  EXPECT(kTokenIdentifier);
  StructDef *struct_def;
  ECHECK(StartStruct(name, &struct_def));
  struct_def->doc_comment = dc;
  struct_def->fixed = fixed;
  if (filename && !opts.project_root.empty()) {
    struct_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  ECHECK(ParseMetaData(&struct_def->attributes));
  struct_def->sortbysize =
      struct_def->attributes.Lookup("original_order") == nullptr && !fixed;
  EXPECT('{');
  while (token_ != '}') ECHECK(ParseField(*struct_def));
  if (fixed) {
    const auto force_align = struct_def->attributes.Lookup("force_align");
    if (force_align) {
      size_t align;
      ECHECK(ParseAlignAttribute(force_align->constant, struct_def->minalign,
                                 &align));
      struct_def->minalign = align;
    }
    if (!struct_def->bytesize) return Error("size 0 structs not allowed");
  }
  struct_def->PadLastField(struct_def->minalign);
  // Check if this is a table that has manual id assignments
  auto &fields = struct_def->fields.vec;
  if (!fixed && fields.size()) {
    size_t num_id_fields = 0;
    for (auto it = fields.begin(); it != fields.end(); ++it) {
      if ((*it)->attributes.Lookup("id")) num_id_fields++;
    }
    // If any fields have ids..
    if (num_id_fields || opts.require_explicit_ids) {
      // Then all fields must have them.
      if (num_id_fields != fields.size()) {
        if (opts.require_explicit_ids) {
          return Error(
              "all fields must have an 'id' attribute when "
              "--require-explicit-ids is used");
        } else {
          return Error(
              "either all fields or no fields must have an 'id' attribute");
        }
      }
      // Simply sort by id, then the fields are the same as if no ids had
      // been specified.
      std::sort(fields.begin(), fields.end(), compareFieldDefs);
      // Verify we have a contiguous set, and reassign vtable offsets.
      FLATBUFFERS_ASSERT(fields.size() <=
                         flatbuffers::numeric_limits<voffset_t>::max());
      for (voffset_t i = 0; i < static_cast<voffset_t>(fields.size()); i++) {
        auto &field = *fields[i];
        const auto &id_str = field.attributes.Lookup("id")->constant;

        // Metadata values have a dynamic type, they can be `float`, 'int', or
        // 'string`.
        // The FieldIndexToOffset(i) expects the voffset_t so `id` is limited by
        // this type.
        voffset_t id = 0;
        const auto done = !atot(id_str.c_str(), *this, &id).Check();
        if (!done)
          return Error("field id\'s must be non-negative number, field: " +
                       field.name + ", id: " + id_str);
        if (i != id)
          return Error("field id\'s must be consecutive from 0, id " +
                       NumToString(i) + " missing or set twice, field: " +
                       field.name + ", id: " + id_str);
        field.value.offset = FieldIndexToOffset(i);
      }
    }
  }

  ECHECK(
      CheckClash(fields, struct_def, UnionTypeFieldSuffix(), BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "Type", BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "_length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "Length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "_byte_vector", BASE_TYPE_STRING));
  ECHECK(CheckClash(fields, struct_def, "ByteVector", BASE_TYPE_STRING));
  EXPECT('}');
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(struct_def->name);
  if (types_.Add(qualified_name,
                 new Type(BASE_TYPE_STRUCT, struct_def, nullptr)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}